

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::ClientImpl::process_socket
          (ClientImpl *this,Socket *socket,function<bool_(httplib::Stream_&)> *callback)

{
  _Manager_type p_Var1;
  bool bVar2;
  long lVar3;
  _Any_data local_88;
  _Manager_type local_78;
  _Invoker_type local_70;
  Stream local_68;
  socket_t local_60;
  time_t local_58;
  time_t local_50;
  time_t local_48;
  time_t local_40;
  void *local_38;
  void *pvStack_30;
  long local_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  local_60 = socket->sock;
  local_58 = this->read_timeout_sec_;
  local_50 = this->read_timeout_usec_;
  local_48 = this->write_timeout_sec_;
  local_40 = this->write_timeout_usec_;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = (_Manager_type)0x0;
  local_70 = callback->_M_invoker;
  p_Var1 = (callback->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_88._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(callback->super__Function_base)._M_functor;
    local_88._8_8_ = *(undefined8 *)((long)&(callback->super__Function_base)._M_functor + 8);
    (callback->super__Function_base)._M_manager = (_Manager_type)0x0;
    callback->_M_invoker = (_Invoker_type)0x0;
    local_78 = p_Var1;
  }
  local_68._vptr_Stream = (_func_int **)&PTR__SocketStream_00170050;
  local_38 = (void *)0x0;
  pvStack_30 = (void *)0x0;
  local_28 = 0;
  local_38 = operator_new(0x1000);
  lVar3 = (long)local_38 + 0x1000;
  pvStack_30 = local_38;
  local_28 = lVar3;
  memset(local_38,0,0x1000);
  local_20 = 0;
  uStack_18 = 0;
  pvStack_30 = (void *)lVar3;
  if (local_78 != (_Manager_type)0x0) {
    bVar2 = (*local_70)(&local_88,&local_68);
    local_68._vptr_Stream = (_func_int **)&PTR__SocketStream_00170050;
    if (local_38 != (void *)0x0) {
      operator_delete(local_38,local_28 - (long)local_38);
    }
    if (local_78 != (_Manager_type)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
    return bVar2;
  }
  std::__throw_bad_function_call();
}

Assistant:

inline bool
ClientImpl::process_socket(const Socket &socket,
                           std::function<bool(Stream &strm)> callback) {
  return detail::process_client_socket(
      socket.sock, read_timeout_sec_, read_timeout_usec_, write_timeout_sec_,
      write_timeout_usec_, std::move(callback));
}